

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_tri_quality_around(REF_GRID ref_grid,REF_INT node,REF_DBL *min_quality)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  uint uVar1;
  bool bVar2;
  REF_INT local_e4;
  REF_DBL local_e0;
  REF_INT local_d8;
  int local_d4;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL quality;
  REF_INT local_b8;
  REF_BOOL none_found;
  REF_INT nodes [27];
  REF_INT local_40;
  int local_3c;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_DBL *min_quality_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[3];
  quality._4_4_ = 1;
  *min_quality = 1.0;
  if ((node < 0) || (ref_cell_00->ref_adj->nnode <= node)) {
    local_d4 = -1;
  }
  else {
    local_d4 = ref_cell_00->ref_adj->first[node];
  }
  local_3c = local_d4;
  if (local_d4 == -1) {
    local_d8 = -1;
  }
  else {
    local_d8 = ref_cell_00->ref_adj->item[local_d4].ref;
  }
  local_40 = local_d8;
  while( true ) {
    if (local_3c == -1) {
      bVar2 = quality._4_4_ != 0;
      if (bVar2) {
        *min_quality = -2.0;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0xb4,"ref_smooth_tri_quality_around","no triangle found, can not compute quality");
      }
      ref_grid_local._4_4_ = (uint)bVar2;
      return ref_grid_local._4_4_;
    }
    uVar1 = ref_cell_nodes(ref_cell_00,local_40,&local_b8);
    if (uVar1 != 0) break;
    quality._4_4_ = 0;
    uVar1 = ref_node_tri_quality(ref_node_00,&local_b8,(REF_DBL *)&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0xae
             ,"ref_smooth_tri_quality_around",(ulong)uVar1,"qual");
      return uVar1;
    }
    if (_ref_private_macro_code_rss_1 <= *min_quality) {
      local_e0 = _ref_private_macro_code_rss_1;
    }
    else {
      local_e0 = *min_quality;
    }
    *min_quality = local_e0;
    local_3c = ref_cell_00->ref_adj->item[local_3c].next;
    if (local_3c == -1) {
      local_e4 = -1;
    }
    else {
      local_e4 = ref_cell_00->ref_adj->item[local_3c].ref;
    }
    local_40 = local_e4;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0xac,
         "ref_smooth_tri_quality_around",(ulong)uVar1,"nodes");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tri_quality_around(REF_GRID ref_grid,
                                                 REF_INT node,
                                                 REF_DBL *min_quality) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL none_found = REF_TRUE;
  REF_DBL quality;

  *min_quality = 1.0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    none_found = REF_FALSE;
    RSS(ref_node_tri_quality(ref_node, nodes, &quality), "qual");
    *min_quality = MIN(*min_quality, quality);
  }

  if (none_found) {
    *min_quality = -2.0;
    THROW("no triangle found, can not compute quality");
  }

  return REF_SUCCESS;
}